

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O2

deUint32 vk::BinaryRegistryDetail::anon_unknown_8::addAndCountNodes
                   (BinaryIndexNode *index,deUint32 baseOffset,SparseIndexNode *group)

{
  SparseIndexNode *group_00;
  deUint32 dVar1;
  size_t childNdx;
  ulong uVar2;
  deUint32 baseOffset_00;
  ulong uVar3;
  deUint32 dVar4;
  ulong uVar5;
  
  uVar5 = (long)(group->children).
                super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(group->children).
                super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar3 = uVar5 & 0xffffffff;
  for (uVar2 = 0; dVar4 = (deUint32)uVar5, uVar3 != uVar2; uVar2 = uVar2 + 1) {
    group_00 = (group->children).
               super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar2];
    baseOffset_00 = dVar4 + baseOffset;
    dVar1 = addAndCountNodes(index + (uVar5 & 0xffffffff),baseOffset_00,group_00);
    index[uVar2].word = group_00->word;
    if (dVar1 == 0) {
      baseOffset_00 = group_00->index;
    }
    index[uVar2].index = baseOffset_00;
    uVar5 = (ulong)(dVar1 + dVar4);
  }
  return dVar4;
}

Assistant:

deUint32 addAndCountNodes (BinaryIndexNode* index, deUint32 baseOffset, const SparseIndexNode* group)
{
	const deUint32	numLocalNodes	= (deUint32)group->children.size();
	deUint32		curOffset		= numLocalNodes;

	// Must be normalized prior to construction of final index
	DE_ASSERT(group->children.empty() || group->children.back()->word == 0);

	for (size_t childNdx = 0; childNdx < numLocalNodes; childNdx++)
	{
		const SparseIndexNode*	child		= group->children[childNdx];
		const deUint32			subtreeSize	= addAndCountNodes(index+curOffset, baseOffset+curOffset, child);

		index[childNdx].word = child->word;

		if (subtreeSize == 0)
			index[childNdx].index = child->index;
		else
		{
			DE_ASSERT(child->index == 0);
			index[childNdx].index = baseOffset+curOffset;
		}

		curOffset += subtreeSize;
	}

	return curOffset;
}